

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O1

void writeRaw(FILE *outf,char *groupname,dotNode *(*results) [7],float probeRad,char *label,
             float density,int conFlag)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int iVar5;
  atom *src;
  atom *targ;
  residue_t *prVar6;
  dotNode_t *pdVar7;
  char *pcVar8;
  char *pcVar9;
  long lVar10;
  ulong uVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  float local_98;
  float local_94;
  float local_90;
  uint local_88;
  
  lVar10 = 0;
  do {
    uVar11 = 0;
    do {
      if (results[lVar10][uVar11] == (dotNode *)0x0) {
        pdVar7 = (dotNode *)0x0;
      }
      else {
        pdVar7 = Condense(results[lVar10][uVar11],conFlag);
        results[lVar10][uVar11] = pdVar7;
      }
      if (pdVar7 != (dotNode *)0x0) {
        iVar5 = (&DAT_0013eb18)[uVar11];
        do {
          fprintf((FILE *)outf,"%s:%s:%s:",label,groupname,(long)&DAT_0013eb18 + (long)iVar5);
          src = pdVar7->a;
          targ = pdVar7->t;
          prVar6 = src->r;
          fprintf((FILE *)outf,"%s%4.4s%c%s %s%c:",prVar6->chain,prVar6->Hy36resno,
                  (ulong)(uint)(int)prVar6->resInsCode,prVar6->resname,src->atomname,
                  (ulong)(uint)(int)src->altConf);
          if (targ == (atom *)0x0) {
            fwrite(":::::::",7,1,(FILE *)outf);
          }
          else {
            prVar6 = targ->r;
            fprintf((FILE *)outf,"%s%4.4s%c%s %s%c:",prVar6->chain,prVar6->Hy36resno,
                    (ulong)(uint)(int)prVar6->resInsCode,prVar6->resname,targ->atomname,
                    (ulong)(uint)(int)targ->altConf);
            fVar1 = src->radius;
            fVar2 = targ->radius;
            dVar12 = v3distance(&src->loc,&targ->loc);
            fVar3 = pdVar7->gap;
            if (OldStyleU == '\x01') {
              fVar4 = src->radius;
              dVar13 = (double)((targ->radius * probeRad) /
                               ((fVar4 + probeRad) * (fVar4 + targ->radius)));
              if (dVar13 < 0.0) {
                dVar13 = sqrt(dVar13);
              }
              else {
                dVar13 = SQRT(dVar13);
              }
              local_90 = (float)(((double)fVar4 + (double)fVar4) * dVar13);
              local_94 = dot2bullsEye(&pdVar7->loc,src,targ);
              local_98 = dot2srcCenter(&pdVar7->loc,src,targ);
            }
            dVar13 = v3distance(&pdVar7->loc,&pdVar7->spike);
            local_88 = (uint)uVar11;
            if (local_88 < 7) {
              (*(code *)(&DAT_0013eae4 + *(int *)(&DAT_0013eae4 + (uVar11 & 0xffffffff) * 4)))();
              return;
            }
            if (conFlag == 0) {
              if (LOneDotEach == '\x01') {
                fprintf((FILE *)outf,"%.2f:",(double)pdVar7->angle);
              }
            }
            else {
              fprintf((FILE *)outf,"%i:",(ulong)(uint)pdVar7->dotCount);
            }
            if (OldStyleU == '\x01') {
              dVar14 = (double)local_90;
              dVar15 = (double)local_94;
              dVar16 = (double)local_98;
            }
            else {
              dVar14 = (pdVar7->spike).x;
              dVar15 = (pdVar7->spike).y;
              dVar16 = (pdVar7->spike).z;
            }
            fprintf((FILE *)outf,"%.3f:%.3f:%.3f:%.3f:%.3f:%.3f:%.4f",
                    (double)(float)(dVar12 - (double)(fVar1 + fVar2)),(double)fVar3,dVar14,dVar15,
                    dVar16,(double)(float)dVar13);
          }
          pcVar8 = getAtomName((int)lVar10);
          if (targ == (atom *)0x0) {
            fprintf((FILE *)outf,":%s:%s:%.3f:%.3f:%.3f",(pdVar7->loc).x,(pdVar7->loc).y,
                    (pdVar7->loc).z,pcVar8,"");
            fprintf((FILE *)outf,":%.2f:\n",(double)src->bval);
          }
          else {
            pcVar9 = getAtomName(targ->atomclass);
            fprintf((FILE *)outf,":%s:%s:%.3f:%.3f:%.3f",(pdVar7->loc).x,(pdVar7->loc).y,
                    (pdVar7->loc).z,pcVar8,pcVar9);
            fprintf((FILE *)outf,":%.2f:%.2f\n",(double)src->bval,(double)targ->bval);
          }
          pdVar7 = pdVar7->next;
        } while (pdVar7 != (dotNode_t *)0x0);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != 7);
    lVar10 = lVar10 + 1;
    if (lVar10 == 0x72) {
      return;
    }
  } while( true );
}

Assistant:

void writeRaw(FILE *outf, char* groupname, dotNode *results[][NODEWIDTH],
	       float probeRad, char* label, float density, int conFlag) //conFlag added SJ 10/07/2011
{
   int i, j;
   dotNode *node;
   atom *a, *t;
  // char *mast[NODEWIDTH] = {"wc", "cc", "so", "bo", "hb"};
   char *mast[NODEWIDTH] = {"wc","cc","wh","so","bo","wo","hb"}; /* 04/10/2015 SJ to changed to match new categories of weak H bonds and worse overlap (these lists are made only if LweakHbonds and LworseOverlap are true respectively). see NODEWIDTH probe.h*/
   
   float gap, sl, dtgp, ke2be, d2be, d2sc, score;
   double scaledGap;
   for (i = 0; i < NUMATOMTYPES; i++)
   {/*loop over NUMATOMTYPES*/

      for (j = 0; j < NODEWIDTH; j++)
      {/*loop over NODEWIDTH*/

         node = results[i][j];
         if(node) // added 10/05/11 - SJ for condensing rawOutput
         {
             node = Condense(node,conFlag);
             results[i][j]=node;
         }
         while(node)
         {/*while node...*/
             fprintf(outf, "%s:%s:%s:", label, groupname, mast[j]);
             a = node->a;
             t = node->t;
             
             fprintf(outf, "%s%4.4s%c%s %s%c:",
                     a->r->chain, a->r->Hy36resno, a->r->resInsCode,
                     a->r->resname,a->atomname, a->altConf);
             
             if(t)
             {/*t node exists*/
                 fprintf(outf, "%s%4.4s%c%s %s%c:",
                         t->r->chain, t->r->Hy36resno, t->r->resInsCode,
                         t->r->resname,t->atomname, t->altConf);
                 gap = gapSize(&(a->loc), &(t->loc),(a->radius + t->radius));
                 dtgp = node->gap;
                 if (OldStyleU)
                 {
                     ke2be = kissEdge2bullsEye(a->radius, t->radius, probeRad);
                     d2be = dot2bullsEye(&(node->loc), a, t);
                     d2sc = dot2srcCenter(&(node->loc), a, t);
                 }
                 sl = gapSize(&(node->loc), &(node->spike), 0.0);
                 score = 0.0;
                 switch(j) /* SJ 04/10/2015 changed to include new categories*/
                 {
                    case 0:
                    case 1:
                           scaledGap = dtgp/GAPweight;
                           score = exp(-scaledGap*scaledGap);
                           break;
                    case 2: /* TODO: SJ weak H bonds, don't know what to do here, because they can be both wc and cc, so will have to check*/
                    case 3: /* small overlap, doing nothing, as before*/
                    case 4: score = -BUMPweight * sl; break;
                    case 5: score = -BUMPweight * sl; break; /* worse overlap, same as bad overlap*/
                    case 6: score =    HBweight * sl; break;
                 }
                 if(conFlag)
                 {
                      fprintf(outf,"%i:",node->dotCount);
                 }
                 else if(LOneDotEach)  /*dcr20120120*/
                 {
                      fprintf(outf,"%.2f:",node->angle);
                 }
                 if (OldStyleU)
                 {
                     fprintf(outf, "%.3f:%.3f:%.3f:%.3f:%.3f:%.3f:%.4f",
                             gap, dtgp, ke2be, d2be, d2sc, sl, score/density);
                 }
                 else
                 {
                     fprintf(outf, "%.3f:%.3f:%.3f:%.3f:%.3f:%.3f:%.4f",
                             gap, dtgp, node->spike.x, node->spike.y,
                             node->spike.z, sl, score/density);
                 }
             }/*t node exists*/
             else
             {
                 fprintf(outf, ":::::::");
             }

             fprintf(outf,":%s:%s:%.3f:%.3f:%.3f",
                         getAtomName(i),(t?getAtomName(t->atomclass):""),
                         node->loc.x,node->loc.y,node->loc.z);

             if(t)
             {
                 fprintf(outf, ":%.2f:%.2f\n", a->bval, t->bval);
             }
             else
             {
                 fprintf(outf, ":%.2f:\n", a->bval);
             }
             node = node->next;
         }/*while node...*/
      }/*loop over NODEWIDTH*/
   }/*loop over NUMATOMTYPES*/
}